

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

_Bool xfer_download_data(fxp_xfer *xfer,void **buf,int *len)

{
  req *prVar1;
  req **pprVar2;
  req *ptr;
  char *pcVar3;
  int iVar4;
  
  ptr = xfer->head;
  if (ptr == (req *)0x0) {
    pcVar3 = (char *)0x0;
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    pcVar3 = (char *)0x0;
    do {
      if ((ptr->complete == 0) || (pcVar3 != (char *)0x0)) break;
      if (0 < ptr->complete) {
        pcVar3 = ptr->buffer;
        iVar4 = ptr->retlen;
      }
      prVar1 = ptr->next;
      xfer->head = prVar1;
      pprVar2 = &prVar1->prev;
      if (prVar1 == (req *)0x0) {
        pprVar2 = &xfer->tail;
      }
      *pprVar2 = (req *)0x0;
      xfer->req_totalsize = xfer->req_totalsize - ptr->len;
      safefree(ptr);
      ptr = xfer->head;
    } while (ptr != (req *)0x0);
  }
  if (pcVar3 != (char *)0x0) {
    *buf = pcVar3;
    *len = iVar4;
  }
  return pcVar3 != (char *)0x0;
}

Assistant:

bool xfer_download_data(struct fxp_xfer *xfer, void **buf, int *len)
{
    void *retbuf = NULL;
    int retlen = 0;

    /*
     * Discard anything at the head of the rr queue with complete <
     * 0; return the first thing with complete > 0.
     */
    while (xfer->head && xfer->head->complete && !retbuf) {
        struct req *rr = xfer->head;

        if (rr->complete > 0) {
            retbuf = rr->buffer;
            retlen = rr->retlen;
#ifdef DEBUG_DOWNLOAD
            printf("handing back data from read request %p\n", rr);
#endif
        }
#ifdef DEBUG_DOWNLOAD
        else
            printf("skipping failed read request %p\n", rr);
#endif

        xfer->head = xfer->head->next;
        if (xfer->head)
            xfer->head->prev = NULL;
        else
            xfer->tail = NULL;
        xfer->req_totalsize -= rr->len;
        sfree(rr);
    }

    if (retbuf) {
        *buf = retbuf;
        *len = retlen;
        return true;
    } else
        return false;
}